

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptNativeFloatArray::JavascriptNativeFloatArray
          (JavascriptNativeFloatArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase **ppSVar2;
  SparseArraySegment<double> *this_00;
  uint32 size_local;
  DynamicType *type_local;
  JavascriptNativeFloatArray *this_local;
  
  JavascriptNativeArray::JavascriptNativeArray(&this->super_JavascriptNativeArray,type);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01e021a8;
  pSVar1 = &Js::JavascriptArray::
            DetermineInlineHeadSegmentPointer<Js::JavascriptNativeFloatArray,0u,false>(this)->
            super_SparseArraySegmentBase;
  Js::JavascriptArray::SetHeadAndLastUsedSegment((JavascriptArray *)this,pSVar1);
  pSVar1 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                     (&(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  pSVar1->size = size;
  pSVar1 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                     (&(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptNativeArray).super_JavascriptArray.head);
  this_00 = SparseArraySegment<double>::From(*ppSVar2);
  SparseArraySegment<double>::FillSegmentBuffer(this_00,0,size);
  return;
}

Assistant:

JavascriptNativeFloatArray::JavascriptNativeFloatArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeFloatArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<double>::From(head)->FillSegmentBuffer(0, size);
    }